

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O3

void __thiscall VGMPlayer::Cmd_invalid(VGMPlayer *this)

{
  PLAYER_EVENT_CB p_Var1;
  
  this->_playState = this->_playState | 2;
  this->_psTrigger = this->_psTrigger | 2;
  p_Var1 = (this->super_PlayerBase)._eventCbFunc;
  if (p_Var1 != (PLAYER_EVENT_CB)0x0) {
    (*p_Var1)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x04',(void *)0x0);
  }
  emu_logf(&this->_logger,'\x01',"Invalid VGM command %02X found! (filePos 0x%06X)\n",
           (ulong)this->_fileData[this->_filePos]);
  return;
}

Assistant:

void VGMPlayer::Cmd_invalid(void)
{
	_playState |= PLAYSTATE_END;
	_psTrigger |= PLAYSTATE_END;
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_END, NULL);
	emu_logf(&_logger, PLRLOG_ERROR, "Invalid VGM command %02X found! (filePos 0x%06X)\n", fData[0x00], _filePos);
	return;
}